

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateSource
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  int32_t key;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer ppEVar5;
  pointer ppEVar6;
  bool include_default;
  bool bVar7;
  int iVar8;
  FieldGeneratorMap *this_00;
  FieldGenerator *pFVar9;
  tuple<const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  tVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  __uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  _Var13;
  AlphaNum *a;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  AlphaNum *a_00;
  AlphaNum *a_01;
  Descriptor *extraout_RDX_02;
  Descriptor *pDVar14;
  Descriptor *descriptor;
  string *psVar15;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  pointer ppEVar16;
  int i_1;
  pointer puVar17;
  unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
  *generator;
  long lVar18;
  long *plVar19;
  pointer puVar20;
  pointer puVar21;
  int i;
  long lVar22;
  ulong uVar23;
  string suffix_added;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  sorted_fields;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  size_order_fields;
  string parent_class_ref;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  init_flags;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  TextFormatDecodeData text_format_decode_data;
  key_type local_b0;
  string field_description_type;
  string local_70;
  string local_50;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) == '\0') {
    psVar15 = &this->class_name_;
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"#pragma mark - $classname$\n\n",(char (*) [10])0x3dd2a7,psVar15);
    if ((this->deprecated_attribute_)._M_string_length != 0) {
      io::Printer::Print<>
                (printer,
                 "#pragma clang diagnostic push\n#pragma clang diagnostic ignored \"-Wdeprecated-implementations\"\n\n"
                );
    }
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"@implementation $classname$\n\n",(char (*) [10])0x3dd2a7,psVar15);
    puVar2 = (this->oneof_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar17 = (this->oneof_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar2;
        puVar17 = puVar17 + 1) {
      OneofGenerator::GeneratePropertyImplementation
                ((puVar17->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_false>
                 ._M_head_impl,printer);
    }
    this_00 = &this->field_generators_;
    lVar18 = 0;
    for (lVar22 = 0; pDVar14 = this->descriptor_, lVar22 < *(int *)(pDVar14 + 4);
        lVar22 = lVar22 + 1) {
      pFVar9 = FieldGeneratorMap::get
                         (this_00,(FieldDescriptor *)(*(long *)(pDVar14 + 0x28) + lVar18));
      (*pFVar9->_vptr_FieldGenerator[4])(pFVar9,printer);
      lVar18 = lVar18 + 0x48;
    }
    sorted_fields._M_t.
    super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl =
         (__uniq_ptr_data<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>,_true,_true>
          )anon_unknown_7::SortFieldsByNumber(pDVar14);
    pDVar14 = this->descriptor_;
    uVar1 = *(uint *)(pDVar14 + 4);
    uVar23 = (ulong)(int)uVar1;
    uVar12 = 0xffffffffffffffff;
    if (-1 < (long)uVar23) {
      uVar12 = uVar23 * 8;
    }
    tVar10.
    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
          )operator_new__(uVar12);
    lVar18 = 0;
    uVar12 = 0;
    if (0 < (int)uVar1) {
      uVar12 = (ulong)uVar1;
    }
    _Var13._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl =
         (tuple<const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
          )(tuple<const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
            )tVar10.
             super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
             .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl;
    for (; uVar12 * 0x48 - lVar18 != 0; lVar18 = lVar18 + 0x48) {
      *(long *)_Var13._M_t.
               super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
               _M_head_impl = *(long *)(pDVar14 + 0x28) + lVar18;
      _Var13._M_t.
      super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
      .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl =
           (tuple<const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
            )((long)_Var13._M_t.
                    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                    _M_head_impl + 8);
    }
    if (uVar1 != 0) {
      plVar19 = (long *)(uVar23 * 8 +
                        (long)tVar10.
                              super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                              .
                              super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>
                              ._M_head_impl);
      lVar18 = 0x3f;
      if (uVar23 != 0) {
        for (; uVar23 >> lVar18 == 0; lVar18 = lVar18 + -1) {
        }
      }
      std::
      __introsort_loop<google::protobuf::FieldDescriptor_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                (tVar10.
                 super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                 .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                 _M_head_impl,plVar19,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
      if ((int)uVar1 < 0x11) {
        std::
        __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                  (tVar10.
                   super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                   .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                   _M_head_impl,plVar19);
      }
      else {
        plVar19 = (long *)((long)tVar10.
                                 super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                 .
                                 super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>
                                 ._M_head_impl + 0x80);
        std::
        __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                  (tVar10.
                   super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                   .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                   _M_head_impl,plVar19);
        for (lVar18 = uVar23 * 8 + -0x80; lVar18 != 0; lVar18 = lVar18 + -8) {
          std::
          __unguarded_linear_insert<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                    (plVar19);
          plVar19 = plVar19 + 1;
        }
      }
    }
    sorted_extensions.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sorted_extensions.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sorted_extensions.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    size_order_fields._M_t.
    super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl =
         (__uniq_ptr_data<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>,_true,_true>
          )(__uniq_ptr_data<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>,_true,_true>
            )tVar10.
             super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
             .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl;
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::reserve(&sorted_extensions,(long)*(int *)(this->descriptor_ + 0x78));
    lVar18 = 0;
    for (lVar22 = 0;
        ppEVar6 = sorted_extensions.
                  super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        ppEVar5 = sorted_extensions.
                  super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar22 < *(int *)(this->descriptor_ + 0x78); lVar22 = lVar22 + 1) {
      vars._M_t._M_impl._0_8_ = *(long *)(this->descriptor_ + 0x48) + lVar18;
      std::
      vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
      ::emplace_back<google::protobuf::Descriptor::ExtensionRange_const*>
                ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                  *)&sorted_extensions,(ExtensionRange **)&vars);
      lVar18 = lVar18 + 0x10;
    }
    if (sorted_extensions.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        sorted_extensions.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar22 = (long)sorted_extensions.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)sorted_extensions.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = lVar22 >> 3;
      lVar18 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar18 == 0; lVar18 = lVar18 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                (sorted_extensions.
                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 sorted_extensions.
                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar22 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                  (ppEVar5,ppEVar6);
      }
      else {
        ppEVar16 = ppEVar5 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                  (ppEVar5,ppEVar16);
        for (; ppEVar16 != ppEVar6; ppEVar16 = ppEVar16 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                    (ppEVar16);
        }
      }
    }
    iVar8 = FieldGeneratorMap::CalculateHasBits(this_00);
    uVar12 = 1;
    if (0x1f < (long)iVar8 + 0x1fU) {
      uVar12 = (long)iVar8 + 0x1fU >> 5;
    }
    puVar2 = (this->oneof_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar17 = (this->oneof_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar2;
        puVar17 = puVar17 + 1) {
      OneofGenerator::SetOneofIndexBase
                ((puVar17->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_false>
                 ._M_head_impl,(int)uVar12);
    }
    FieldGeneratorMap::SetOneofIndexBase(this_00,(int)uVar12);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)&vars,
               ((long)(this->oneof_generators_).
                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->oneof_generators_).
                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) + uVar12);
    StrCat_abi_cxx11_(&suffix_added,(protobuf *)&vars,a);
    io::Printer::Print<char[10],std::__cxx11::string,char[19],std::__cxx11::string>
              (printer,
               "\ntypedef struct $classname$__storage_ {\n  uint32_t _has_storage_[$sizeof_has_storage$];\n"
               ,(char (*) [10])0x3dd2a7,psVar15,(char (*) [19])"sizeof_has_storage",&suffix_added);
    std::__cxx11::string::~string((string *)&suffix_added);
    io::Printer::Indent(printer);
    for (lVar18 = 0; lVar18 < *(int *)(this->descriptor_ + 4); lVar18 = lVar18 + 1) {
      pFVar9 = FieldGeneratorMap::get
                         (this_00,*(FieldDescriptor **)
                                   ((long)size_order_fields._M_t.
                                          super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                          .
                                          super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>
                                          ._M_head_impl + lVar18 * 8));
      (*pFVar9->_vptr_FieldGenerator[2])(pFVar9,printer);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"} $classname$__storage_;\n\n",(char (*) [10])0x3dd2a7,psVar15);
    io::Printer::Print<>
              (printer,
               "// This method is threadsafe because it is initially called\n// in +initialize for each subclass.\n+ (GPBDescriptor *)descriptor {\n  static GPBDescriptor *descriptor = nil;\n  if (!descriptor) {\n"
              );
    TextFormatDecodeData::TextFormatDecodeData(&text_format_decode_data);
    iVar8 = *(int *)(this->descriptor_ + 4);
    include_default = FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault(this_00);
    field_description_type._M_dataplus._M_p = (pointer)&field_description_type.field_2;
    field_description_type._M_string_length = 0;
    field_description_type.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&field_description_type);
    if (0 < iVar8) {
      io::Printer::Indent(printer);
      io::Printer::Indent(printer);
      io::Printer::Print<char[23],std::__cxx11::string>
                (printer,"static $field_description_type$ fields[] = {\n",
                 (char (*) [23])"field_description_type",&field_description_type);
      io::Printer::Indent(printer);
      for (lVar18 = 0; lVar18 < *(int *)(this->descriptor_ + 4); lVar18 = lVar18 + 1) {
        pFVar9 = FieldGeneratorMap::get
                           (this_00,*(FieldDescriptor **)
                                     ((long)sorted_fields._M_t.
                                            super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                            .
                                            super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>
                                            ._M_head_impl + lVar18 * 8));
        FieldGenerator::GenerateFieldDescription(pFVar9,printer,include_default);
        bVar7 = FieldGenerator::needs_textformat_name_support(pFVar9);
        if (bVar7) {
          key = *(int32_t *)
                 (*(long *)((long)sorted_fields._M_t.
                                  super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                  .
                                  super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>
                                  ._M_head_impl + lVar18 * 8) + 4);
          FieldGenerator::generated_objc_name_abi_cxx11_((string *)&vars,pFVar9);
          FieldGenerator::raw_field_name_abi_cxx11_(&suffix_added,pFVar9);
          TextFormatDecodeData::AddString
                    (&text_format_decode_data,key,(string *)&vars,&suffix_added);
          std::__cxx11::string::~string((string *)&suffix_added);
          std::__cxx11::string::~string((string *)&vars);
        }
      }
      io::Printer::Outdent(printer);
      io::Printer::Print<>(printer,"};\n");
      io::Printer::Outdent(printer);
      io::Printer::Outdent(printer);
    }
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vars._M_t._M_impl.super__Rb_tree_header._M_header;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string((string *)&suffix_added,"classname",(allocator *)&parent_class_ref)
    ;
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&suffix_added);
    std::__cxx11::string::_M_assign((string *)pmVar11);
    std::__cxx11::string::~string((string *)&suffix_added);
    std::__cxx11::string::string
              ((string *)&suffix_added,"rootclassname",(allocator *)&parent_class_ref);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&suffix_added);
    std::__cxx11::string::_M_assign((string *)pmVar11);
    std::__cxx11::string::~string((string *)&suffix_added);
    std::__cxx11::string::string((string *)&suffix_added,"fields",(allocator *)&parent_class_ref);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&suffix_added);
    std::__cxx11::string::assign((char *)pmVar11);
    std::__cxx11::string::~string((string *)&suffix_added);
    if (iVar8 < 1) {
      std::__cxx11::string::string
                ((string *)&suffix_added,"fields_count",(allocator *)&parent_class_ref);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&suffix_added);
      std::__cxx11::string::assign((char *)pmVar11);
      psVar15 = &suffix_added;
    }
    else {
      std::operator+(&parent_class_ref,"(uint32_t)(sizeof(fields) / sizeof(",&field_description_type
                    );
      std::operator+(&suffix_added,&parent_class_ref,"))");
      std::__cxx11::string::string((string *)&local_b0,"fields_count",(allocator *)&local_70);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&local_b0);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&suffix_added);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&suffix_added);
      psVar15 = &parent_class_ref;
    }
    std::__cxx11::string::~string((string *)psVar15);
    init_flags.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    init_flags.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    init_flags.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string
              ((string *)&suffix_added,"GPBDescriptorInitializationFlag_UsesClassRefs",
               (allocator *)&parent_class_ref);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&init_flags,
               &suffix_added);
    std::__cxx11::string::~string((string *)&suffix_added);
    std::__cxx11::string::string
              ((string *)&suffix_added,"GPBDescriptorInitializationFlag_Proto3OptionalKnown",
               (allocator *)&parent_class_ref);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&init_flags,
               &suffix_added);
    std::__cxx11::string::~string((string *)&suffix_added);
    if (include_default) {
      std::__cxx11::string::string
                ((string *)&suffix_added,"GPBDescriptorInitializationFlag_FieldsWithDefault",
                 (allocator *)&parent_class_ref);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&init_flags,
                 &suffix_added);
      std::__cxx11::string::~string((string *)&suffix_added);
    }
    if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x48) == '\x01') {
      std::__cxx11::string::string
                ((string *)&suffix_added,"GPBDescriptorInitializationFlag_WireFormat",
                 (allocator *)&parent_class_ref);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&init_flags,
                 &suffix_added);
      std::__cxx11::string::~string((string *)&suffix_added);
    }
    BuildFlagsString(&suffix_added,FLAGTYPE_DESCRIPTOR_INITIALIZATION,&init_flags);
    std::__cxx11::string::string((string *)&parent_class_ref,"init_flags",(allocator *)&local_b0);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&parent_class_ref);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&suffix_added);
    std::__cxx11::string::~string((string *)&parent_class_ref);
    std::__cxx11::string::~string((string *)&suffix_added);
    io::Printer::Print(printer,&vars,
                       "    GPBDescriptor *localDescriptor =\n        [GPBDescriptor allocDescriptorForClass:[$classname$ class]\n                                     rootClass:[$rootclassname$ class]\n                                          file:$rootclassname$_FileDescriptor()\n                                        fields:$fields$\n                                    fieldCount:$fields_count$\n                                   storageSize:sizeof($classname$__storage_)\n                                         flags:$init_flags$];\n"
                      );
    pDVar14 = extraout_RDX;
    if ((this->oneof_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->oneof_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      io::Printer::Print<>(printer,"    static const char *oneofs[] = {\n");
      puVar2 = (this->oneof_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar17 = (this->oneof_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar2;
          puVar17 = puVar17 + 1) {
        OneofGenerator::DescriptorName_abi_cxx11_
                  (&suffix_added,
                   (puVar17->_M_t).
                   super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_false>
                   ._M_head_impl);
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,"      \"$name$\",\n",(char (*) [5])0x3de831,&suffix_added);
        std::__cxx11::string::~string((string *)&suffix_added);
      }
      OneofGenerator::HasIndexAsString_abi_cxx11_
                (&suffix_added,
                 (OneofGenerator *)
                 (((this->oneof_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 ._M_t);
      io::Printer::Print<char[16],std::__cxx11::string>
                (printer,
                 "    };\n    [localDescriptor setupOneofs:oneofs\n                           count:(uint32_t)(sizeof(oneofs) / sizeof(char*))\n                   firstHasIndex:$first_has_index$];\n"
                 ,(char (*) [16])"first_has_index",&suffix_added);
      std::__cxx11::string::~string((string *)&suffix_added);
      pDVar14 = extraout_RDX_00;
    }
    if (text_format_decode_data.entries_.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        text_format_decode_data.entries_.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      TextFormatDecodeData::Data_abi_cxx11_(&suffix_added,&text_format_decode_data);
      io::Printer::Print<>
                (printer,
                 "#if !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n    static const char *extraTextFormatInfo ="
                );
      for (uVar12 = 0; uVar12 < suffix_added._M_string_length; uVar12 = uVar12 + 0x28) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&suffix_added);
        CEscape(&local_b0,&local_70);
        EscapeTrigraphs(&parent_class_ref,&local_b0);
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,"\n        \"$data$\"",(char (*) [5])0x3db550,&parent_class_ref);
        std::__cxx11::string::~string((string *)&parent_class_ref);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
      }
      io::Printer::Print<>
                (printer,
                 ";\n    [localDescriptor setupExtraTextInfo:extraTextFormatInfo];\n#endif  // !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n"
                );
      std::__cxx11::string::~string((string *)&suffix_added);
      pDVar14 = extraout_RDX_01;
    }
    if (sorted_extensions.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        sorted_extensions.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      io::Printer::Print<>(printer,"    static const GPBExtensionRange ranges[] = {\n");
      for (uVar12 = 0;
          uVar12 < (ulong)((long)sorted_extensions.
                                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)sorted_extensions.
                                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar12 = uVar12 + 1) {
        strings::AlphaNum::AlphaNum
                  ((AlphaNum *)&suffix_added,
                   sorted_extensions.
                   super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12]->start);
        StrCat_abi_cxx11_(&local_b0,(protobuf *)&suffix_added,a_00);
        strings::AlphaNum::AlphaNum
                  ((AlphaNum *)&parent_class_ref,
                   sorted_extensions.
                   super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12]->end);
        StrCat_abi_cxx11_(&local_70,(protobuf *)&parent_class_ref,a_01);
        io::Printer::Print<char[6],std::__cxx11::string,char[4],std::__cxx11::string>
                  (printer,"      { .start = $start$, .end = $end$ },\n",(char (*) [6])0x3dff68,
                   &local_b0,(char (*) [4])0x3dff79,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      io::Printer::Print<>
                (printer,
                 "    };\n    [localDescriptor setupExtensionRanges:ranges\n                                    count:(uint32_t)(sizeof(ranges) / sizeof(GPBExtensionRange))];\n"
                );
      pDVar14 = extraout_RDX_02;
    }
    descriptor = this->descriptor_;
    if (*(objectivec **)(descriptor + 0x18) != (objectivec *)0x0) {
      ClassName_abi_cxx11_(&suffix_added,*(objectivec **)(descriptor + 0x18),pDVar14);
      ObjCClass(&parent_class_ref,&suffix_added);
      io::Printer::Print<char[17],std::__cxx11::string>
                (printer,"    [localDescriptor setupContainingMessageClass:$parent_class_ref$];\n",
                 (char (*) [17])"parent_class_ref",&parent_class_ref);
      std::__cxx11::string::~string((string *)&parent_class_ref);
      std::__cxx11::string::~string((string *)&suffix_added);
      descriptor = this->descriptor_;
    }
    suffix_added._M_dataplus._M_p = (pointer)&suffix_added.field_2;
    suffix_added._M_string_length = 0;
    suffix_added.field_2._M_local_buf[0] = '\0';
    ClassName(&local_50,descriptor,&suffix_added);
    std::__cxx11::string::~string((string *)&local_50);
    if (suffix_added._M_string_length != 0) {
      io::Printer::Print<char[7],std::__cxx11::string>
                (printer,"    [localDescriptor setupMessageClassNameSuffix:@\"$suffix$\"];\n",
                 (char (*) [7])0x3de682,&suffix_added);
    }
    io::Printer::Print<>
              (printer,
               "    #if defined(DEBUG) && DEBUG\n      NSAssert(descriptor == nil, @\"Startup recursed!\");\n    #endif  // DEBUG\n    descriptor = localDescriptor;\n  }\n  return descriptor;\n}\n\n@end\n\n"
              );
    if ((this->deprecated_attribute_)._M_string_length != 0) {
      io::Printer::Print<>(printer,"#pragma clang diagnostic pop\n\n");
    }
    lVar18 = 0;
    for (lVar22 = 0; lVar22 < *(int *)(this->descriptor_ + 4); lVar22 = lVar22 + 1) {
      pFVar9 = FieldGeneratorMap::get
                         (this_00,(FieldDescriptor *)(*(long *)(this->descriptor_ + 0x28) + lVar18))
      ;
      (*pFVar9->_vptr_FieldGenerator[6])(pFVar9,printer);
      lVar18 = lVar18 + 0x48;
    }
    puVar2 = (this->oneof_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar17 = (this->oneof_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar2;
        puVar17 = puVar17 + 1) {
      OneofGenerator::GenerateClearFunctionImplementation
                ((puVar17->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_false>
                 ._M_head_impl,printer);
    }
    std::__cxx11::string::~string((string *)&suffix_added);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&init_flags);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&vars._M_t);
    std::__cxx11::string::~string((string *)&field_description_type);
    TextFormatDecodeData::~TextFormatDecodeData(&text_format_decode_data);
    std::
    _Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::~_Vector_base(&sorted_extensions.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   );
    std::
    unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ::~unique_ptr(&size_order_fields);
    std::
    unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ::~unique_ptr(&sorted_fields);
  }
  puVar3 = (this->enum_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar20 = (this->enum_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar3; puVar20 = puVar20 + 1
      ) {
    EnumGenerator::GenerateSource
              ((puVar20->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::objectivec::EnumGenerator_*,_false>
               ._M_head_impl,printer);
  }
  puVar4 = (this->nested_message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar21 = (this->nested_message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar4; puVar21 = puVar21 + 1
      ) {
    GenerateSource((puVar21->_M_t).
                   super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
                   ._M_head_impl,printer);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSource(io::Printer* printer) {
  if (!IsMapEntryMessage(descriptor_)) {
    printer->Print(
        "#pragma mark - $classname$\n"
        "\n",
        "classname", class_name_);

    if (!deprecated_attribute_.empty()) {
      // No warnings when compiling the impl of this deprecated class.
      printer->Print(
          "#pragma clang diagnostic push\n"
          "#pragma clang diagnostic ignored \"-Wdeprecated-implementations\"\n"
          "\n");
    }

    printer->Print("@implementation $classname$\n\n",
                   "classname", class_name_);

    for (const auto& generator : oneof_generators_) {
      generator->GeneratePropertyImplementation(printer);
    }

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GeneratePropertyImplementation(printer);
    }

    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    std::unique_ptr<const FieldDescriptor*[]> size_order_fields(
        SortFieldsByStorageSize(descriptor_));

    std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
    sorted_extensions.reserve(descriptor_->extension_range_count());
    for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
      sorted_extensions.push_back(descriptor_->extension_range(i));
    }

    std::sort(sorted_extensions.begin(), sorted_extensions.end(),
         ExtensionRangeOrdering());

    // Assign has bits:
    // 1. FieldGeneratorMap::CalculateHasBits() loops through the fields seeing
    //    who needs has bits and assigning them.
    // 2. FieldGenerator::SetOneofIndexBase() overrides has_bit with a negative
    //    index that groups all the elements in the oneof.
    size_t num_has_bits = field_generators_.CalculateHasBits();
    size_t sizeof_has_storage = (num_has_bits + 31) / 32;
    if (sizeof_has_storage == 0) {
      // In the case where no field needs has bits, don't let the _has_storage_
      // end up as zero length (zero length arrays are sort of a grey area
      // since it has to be at the start of the struct). This also ensures a
      // field with only oneofs keeps the required negative indices they need.
      sizeof_has_storage = 1;
    }
    // Tell all the fields the oneof base.
    for (const auto& generator : oneof_generators_) {
      generator->SetOneofIndexBase(sizeof_has_storage);
    }
    field_generators_.SetOneofIndexBase(sizeof_has_storage);
    // sizeof_has_storage needs enough bits for the single fields that aren't in
    // any oneof, and then one int32 for each oneof (to store the field number).
    sizeof_has_storage += oneof_generators_.size();

    printer->Print(
        "\n"
        "typedef struct $classname$__storage_ {\n"
        "  uint32_t _has_storage_[$sizeof_has_storage$];\n",
        "classname", class_name_,
        "sizeof_has_storage", StrCat(sizeof_has_storage));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(size_order_fields[i])
          .GenerateFieldStorageDeclaration(printer);
    }
    printer->Outdent();

    printer->Print("} $classname$__storage_;\n\n", "classname", class_name_);


    printer->Print(
        "// This method is threadsafe because it is initially called\n"
        "// in +initialize for each subclass.\n"
        "+ (GPBDescriptor *)descriptor {\n"
        "  static GPBDescriptor *descriptor = nil;\n"
        "  if (!descriptor) {\n");

    TextFormatDecodeData text_format_decode_data;
    bool has_fields = descriptor_->field_count() > 0;
    bool need_defaults = field_generators_.DoesAnyFieldHaveNonZeroDefault();
    std::string field_description_type;
    if (need_defaults) {
      field_description_type = "GPBMessageFieldDescriptionWithDefault";
    } else {
      field_description_type = "GPBMessageFieldDescription";
    }
    if (has_fields) {
      printer->Indent();
      printer->Indent();
      printer->Print(
          "static $field_description_type$ fields[] = {\n",
          "field_description_type", field_description_type);
      printer->Indent();
      for (int i = 0; i < descriptor_->field_count(); ++i) {
        const FieldGenerator& field_generator =
            field_generators_.get(sorted_fields[i]);
        field_generator.GenerateFieldDescription(printer, need_defaults);
        if (field_generator.needs_textformat_name_support()) {
          text_format_decode_data.AddString(sorted_fields[i]->number(),
                                            field_generator.generated_objc_name(),
                                            field_generator.raw_field_name());
        }
      }
      printer->Outdent();
      printer->Print(
          "};\n");
      printer->Outdent();
      printer->Outdent();
    }

    std::map<std::string, std::string> vars;
    vars["classname"] = class_name_;
    vars["rootclassname"] = root_classname_;
    vars["fields"] = has_fields ? "fields" : "NULL";
    if (has_fields) {
      vars["fields_count"] =
          "(uint32_t)(sizeof(fields) / sizeof(" + field_description_type + "))";
    } else {
      vars["fields_count"] = "0";
    }

    std::vector<std::string> init_flags;
    init_flags.push_back("GPBDescriptorInitializationFlag_UsesClassRefs");
    init_flags.push_back("GPBDescriptorInitializationFlag_Proto3OptionalKnown");
    if (need_defaults) {
      init_flags.push_back("GPBDescriptorInitializationFlag_FieldsWithDefault");
    }
    if (descriptor_->options().message_set_wire_format()) {
      init_flags.push_back("GPBDescriptorInitializationFlag_WireFormat");
    }
    vars["init_flags"] = BuildFlagsString(FLAGTYPE_DESCRIPTOR_INITIALIZATION,
                                          init_flags);

    printer->Print(
        vars,
        "    GPBDescriptor *localDescriptor =\n"
        "        [GPBDescriptor allocDescriptorForClass:[$classname$ class]\n"
        "                                     rootClass:[$rootclassname$ class]\n"
        "                                          file:$rootclassname$_FileDescriptor()\n"
        "                                        fields:$fields$\n"
        "                                    fieldCount:$fields_count$\n"
        "                                   storageSize:sizeof($classname$__storage_)\n"
        "                                         flags:$init_flags$];\n");
    if (!oneof_generators_.empty()) {
      printer->Print(
          "    static const char *oneofs[] = {\n");
      for (const auto& generator : oneof_generators_) {
        printer->Print("      \"$name$\",\n", "name",
                       generator->DescriptorName());
      }
      printer->Print(
          "    };\n"
          "    [localDescriptor setupOneofs:oneofs\n"
          "                           count:(uint32_t)(sizeof(oneofs) / sizeof(char*))\n"
          "                   firstHasIndex:$first_has_index$];\n",
          "first_has_index", oneof_generators_[0]->HasIndexAsString());
    }
    if (text_format_decode_data.num_entries() != 0) {
      const std::string text_format_data_str(text_format_decode_data.Data());
      printer->Print(
          "#if !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n"
          "    static const char *extraTextFormatInfo =");
      static const int kBytesPerLine = 40;  // allow for escaping
      for (int i = 0; i < text_format_data_str.size(); i += kBytesPerLine) {
        printer->Print(
            "\n        \"$data$\"",
            "data", EscapeTrigraphs(
                CEscape(text_format_data_str.substr(i, kBytesPerLine))));
      }
      printer->Print(
          ";\n"
          "    [localDescriptor setupExtraTextInfo:extraTextFormatInfo];\n"
          "#endif  // !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n");
    }
    if (!sorted_extensions.empty()) {
      printer->Print(
          "    static const GPBExtensionRange ranges[] = {\n");
      for (int i = 0; i < sorted_extensions.size(); i++) {
        printer->Print("      { .start = $start$, .end = $end$ },\n",
                       "start", StrCat(sorted_extensions[i]->start),
                       "end", StrCat(sorted_extensions[i]->end));
      }
      printer->Print(
          "    };\n"
          "    [localDescriptor setupExtensionRanges:ranges\n"
          "                                    count:(uint32_t)(sizeof(ranges) / sizeof(GPBExtensionRange))];\n");
    }
    if (descriptor_->containing_type() != NULL) {
      std::string containing_class = ClassName(descriptor_->containing_type());
      std::string parent_class_ref = ObjCClass(containing_class);
      printer->Print(
          "    [localDescriptor setupContainingMessageClass:$parent_class_ref$];\n",
          "parent_class_ref", parent_class_ref);
    }
    std::string suffix_added;
    ClassName(descriptor_, &suffix_added);
    if (!suffix_added.empty()) {
      printer->Print(
          "    [localDescriptor setupMessageClassNameSuffix:@\"$suffix$\"];\n",
          "suffix", suffix_added);
    }
    printer->Print(
        "    #if defined(DEBUG) && DEBUG\n"
        "      NSAssert(descriptor == nil, @\"Startup recursed!\");\n"
        "    #endif  // DEBUG\n"
        "    descriptor = localDescriptor;\n"
        "  }\n"
        "  return descriptor;\n"
        "}\n\n"
        "@end\n\n");

    if (!deprecated_attribute_.empty()) {
      printer->Print(
          "#pragma clang diagnostic pop\n"
          "\n");
    }

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GenerateCFunctionImplementations(printer);
    }

    for (const auto& generator : oneof_generators_) {
      generator->GenerateClearFunctionImplementation(printer);
    }
  }

  for (const auto& generator : enum_generators_) {
    generator->GenerateSource(printer);
  }

  for (const auto& generator : nested_message_generators_) {
    generator->GenerateSource(printer);
  }
}